

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O0

void __thiscall
Assimp::COBImporter::ReadMat1_Binary
          (COBImporter *this,Scene *out,StreamReaderLE *reader,ChunkInfo *nfo)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int8_t iVar3;
  int16_t iVar4;
  Logger *pLVar5;
  basic_formatter *pbVar6;
  shared_ptr<Assimp::COB::Texture> *psVar7;
  Texture *pTVar8;
  element_type *peVar9;
  float fVar10;
  char local_41a;
  char local_419;
  undefined1 local_418 [6];
  char id [2];
  string local_2a0;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  string local_108;
  reference local_e8;
  Material *mat;
  Material local_d0;
  undefined1 local_40 [8];
  chunk_guard cn;
  ChunkInfo *nfo_local;
  StreamReaderLE *reader_local;
  Scene *out_local;
  COBImporter *this_local;
  
  cn.cur = (long)nfo;
  if (nfo->version < 9) {
    chunk_guard::chunk_guard((chunk_guard *)local_40,nfo,reader);
    COB::Material::Material(&local_d0);
    std::vector<Assimp::COB::Material,_std::allocator<Assimp::COB::Material>_>::push_back
              (&out->materials,&local_d0);
    COB::Material::~Material(&local_d0);
    local_e8 = std::vector<Assimp::COB::Material,_std::allocator<Assimp::COB::Material>_>::back
                         (&out->materials);
    uVar1 = *(undefined8 *)cn.cur;
    uVar2 = *(undefined8 *)(cn.cur + 8);
    (local_e8->super_ChunkInfo).id = (int)uVar1;
    (local_e8->super_ChunkInfo).parent_id = (int)((ulong)uVar1 >> 0x20);
    (local_e8->super_ChunkInfo).version = (int)uVar2;
    (local_e8->super_ChunkInfo).size = (int)((ulong)uVar2 >> 0x20);
    iVar4 = StreamReader<false,_false>::GetI2(reader);
    local_e8->matnum = (int)iVar4;
    iVar3 = StreamReader<false,_false>::GetI1(reader);
    if (iVar3 == 'f') {
      std::__cxx11::string::operator=((string *)&local_e8->type,'\0');
    }
    else if (iVar3 == 'm') {
      std::__cxx11::string::operator=((string *)&local_e8->type,'\x02');
    }
    else if (iVar3 == 'p') {
      std::__cxx11::string::operator=((string *)&local_e8->type,'\x01');
    }
    else {
      pLVar5 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[50]>
                (&local_280,(char (*) [50])"Unrecognized shader type in `Mat1` chunk with id ");
      pbVar6 = (basic_formatter *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         &local_280,(uint *)cn.cur);
      Formatter::basic_formatter::operator_cast_to_string(&local_108,pbVar6);
      Logger::error(pLVar5,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_280);
      std::__cxx11::string::operator=((string *)&local_e8->type,'\0');
    }
    iVar3 = StreamReader<false,_false>::GetI1(reader);
    if (iVar3 == 'a') {
      local_e8->autofacet = AUTOFACETED;
    }
    else if (iVar3 == 'f') {
      local_e8->autofacet = FACETED;
    }
    else if (iVar3 == 's') {
      local_e8->autofacet = SMOOTH;
    }
    else {
      pLVar5 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[52]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_418,
                 (char (*) [52])"Unrecognized faceting mode in `Mat1` chunk with id ");
      pbVar6 = (basic_formatter *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         local_418,(uint *)cn.cur);
      Formatter::basic_formatter::operator_cast_to_string(&local_2a0,pbVar6);
      Logger::error(pLVar5,&local_2a0);
      std::__cxx11::string::~string((string *)&local_2a0);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_418);
      local_e8->autofacet = FACETED;
    }
    iVar3 = StreamReader<false,_false>::GetI1(reader);
    local_e8->autofacet_angle = (float)(int)iVar3;
    fVar10 = StreamReader<false,_false>::GetF4(reader);
    (local_e8->rgb).r = fVar10;
    fVar10 = StreamReader<false,_false>::GetF4(reader);
    (local_e8->rgb).g = fVar10;
    fVar10 = StreamReader<false,_false>::GetF4(reader);
    (local_e8->rgb).b = fVar10;
    fVar10 = StreamReader<false,_false>::GetF4(reader);
    local_e8->alpha = fVar10;
    fVar10 = StreamReader<false,_false>::GetF4(reader);
    local_e8->ka = fVar10;
    fVar10 = StreamReader<false,_false>::GetF4(reader);
    local_e8->ks = fVar10;
    fVar10 = StreamReader<false,_false>::GetF4(reader);
    local_e8->exp = fVar10;
    fVar10 = StreamReader<false,_false>::GetF4(reader);
    local_e8->ior = fVar10;
    local_41a = StreamReader<false,_false>::GetI1(reader);
    local_419 = StreamReader<false,_false>::GetI1(reader);
    if ((local_41a == 'e') && (local_419 == ':')) {
      psVar7 = &local_e8->tex_env;
      pTVar8 = (Texture *)operator_new(0x38);
      (pTVar8->transform).mTranslation.x = 0.0;
      (pTVar8->transform).mTranslation.y = 0.0;
      (pTVar8->transform).mScaling.x = 0.0;
      (pTVar8->transform).mScaling.y = 0.0;
      (pTVar8->path).field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&(pTVar8->path).field_2 + 8) = 0;
      *(undefined8 *)&pTVar8->path = 0;
      (pTVar8->path)._M_string_length = 0;
      *(undefined8 *)&(pTVar8->transform).mRotation = 0;
      COB::Texture::Texture(pTVar8);
      std::__shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>::
      reset<Assimp::COB::Texture>
                (&psVar7->super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>,
                 pTVar8);
      StreamReader<false,_false>::GetI1(reader);
      peVar9 = std::
               __shared_ptr_access<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_e8->tex_env);
      ReadString_Binary(this,&peVar9->path,reader);
      local_41a = StreamReader<false,_false>::GetI1(reader);
      local_419 = StreamReader<false,_false>::GetI1(reader);
    }
    if ((local_41a == 't') && (local_419 == ':')) {
      psVar7 = &local_e8->tex_color;
      pTVar8 = (Texture *)operator_new(0x38);
      (pTVar8->transform).mTranslation.x = 0.0;
      (pTVar8->transform).mTranslation.y = 0.0;
      (pTVar8->transform).mScaling.x = 0.0;
      (pTVar8->transform).mScaling.y = 0.0;
      (pTVar8->path).field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&(pTVar8->path).field_2 + 8) = 0;
      *(undefined8 *)&pTVar8->path = 0;
      (pTVar8->path)._M_string_length = 0;
      *(undefined8 *)&(pTVar8->transform).mRotation = 0;
      COB::Texture::Texture(pTVar8);
      std::__shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>::
      reset<Assimp::COB::Texture>
                (&psVar7->super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>,
                 pTVar8);
      StreamReader<false,_false>::GetI1(reader);
      peVar9 = std::
               __shared_ptr_access<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_e8->tex_color);
      ReadString_Binary(this,&peVar9->path,reader);
      fVar10 = StreamReader<false,_false>::GetF4(reader);
      peVar9 = std::
               __shared_ptr_access<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_e8->tex_color);
      (peVar9->transform).mTranslation.x = fVar10;
      fVar10 = StreamReader<false,_false>::GetF4(reader);
      peVar9 = std::
               __shared_ptr_access<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_e8->tex_color);
      (peVar9->transform).mTranslation.y = fVar10;
      fVar10 = StreamReader<false,_false>::GetF4(reader);
      peVar9 = std::
               __shared_ptr_access<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_e8->tex_color);
      (peVar9->transform).mScaling.x = fVar10;
      fVar10 = StreamReader<false,_false>::GetF4(reader);
      peVar9 = std::
               __shared_ptr_access<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_e8->tex_color);
      (peVar9->transform).mScaling.y = fVar10;
      local_41a = StreamReader<false,_false>::GetI1(reader);
      local_419 = StreamReader<false,_false>::GetI1(reader);
    }
    if ((local_41a == 'b') && (local_419 == ':')) {
      psVar7 = &local_e8->tex_bump;
      pTVar8 = (Texture *)operator_new(0x38);
      (pTVar8->transform).mTranslation.x = 0.0;
      (pTVar8->transform).mTranslation.y = 0.0;
      (pTVar8->transform).mScaling.x = 0.0;
      (pTVar8->transform).mScaling.y = 0.0;
      (pTVar8->path).field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&(pTVar8->path).field_2 + 8) = 0;
      *(undefined8 *)&pTVar8->path = 0;
      (pTVar8->path)._M_string_length = 0;
      *(undefined8 *)&(pTVar8->transform).mRotation = 0;
      COB::Texture::Texture(pTVar8);
      std::__shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>::
      reset<Assimp::COB::Texture>
                (&psVar7->super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>,
                 pTVar8);
      StreamReader<false,_false>::GetI1(reader);
      peVar9 = std::
               __shared_ptr_access<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_e8->tex_bump);
      ReadString_Binary(this,&peVar9->path,reader);
      fVar10 = StreamReader<false,_false>::GetF4(reader);
      peVar9 = std::
               __shared_ptr_access<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_e8->tex_bump);
      (peVar9->transform).mTranslation.x = fVar10;
      fVar10 = StreamReader<false,_false>::GetF4(reader);
      peVar9 = std::
               __shared_ptr_access<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_e8->tex_bump);
      (peVar9->transform).mTranslation.y = fVar10;
      fVar10 = StreamReader<false,_false>::GetF4(reader);
      peVar9 = std::
               __shared_ptr_access<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_e8->tex_bump);
      (peVar9->transform).mScaling.x = fVar10;
      fVar10 = StreamReader<false,_false>::GetF4(reader);
      peVar9 = std::
               __shared_ptr_access<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_e8->tex_bump);
      (peVar9->transform).mScaling.y = fVar10;
      StreamReader<false,_false>::GetF4(reader);
    }
    StreamReader<false,_false>::IncPtr(reader,-2);
    chunk_guard::~chunk_guard((chunk_guard *)local_40);
  }
  else {
    UnsupportedChunk_Binary(this,reader,nfo,"Mat1");
  }
  return;
}

Assistant:

void COBImporter::ReadMat1_Binary(COB::Scene& out, StreamReaderLE& reader, const ChunkInfo& nfo)
{
    if(nfo.version > 8) {
        return UnsupportedChunk_Binary(reader,nfo,"Mat1");
    }

    const chunk_guard cn(nfo,reader);

    out.materials.push_back(Material());
    Material& mat = out.materials.back();
    mat = nfo;

    mat.matnum = reader.GetI2();
    switch(reader.GetI1()) {
        case 'f':
            mat.type = Material::FLAT;
            break;
        case 'p':
            mat.type = Material::PHONG;
            break;
        case 'm':
            mat.type = Material::METAL;
            break;
        default:
            ASSIMP_LOG_ERROR_F( "Unrecognized shader type in `Mat1` chunk with id ", nfo.id );
            mat.type = Material::FLAT;
    }

    switch(reader.GetI1()) {
        case 'f':
            mat.autofacet = Material::FACETED;
            break;
        case 'a':
            mat.autofacet = Material::AUTOFACETED;
            break;
        case 's':
            mat.autofacet = Material::SMOOTH;
            break;
        default:
            ASSIMP_LOG_ERROR_F( "Unrecognized faceting mode in `Mat1` chunk with id ", nfo.id );
            mat.autofacet = Material::FACETED;
    }
    mat.autofacet_angle = static_cast<float>(reader.GetI1());

    mat.rgb.r = reader.GetF4();
    mat.rgb.g = reader.GetF4();
    mat.rgb.b = reader.GetF4();

    mat.alpha = reader.GetF4();
    mat.ka    = reader.GetF4();
    mat.ks    = reader.GetF4();
    mat.exp   = reader.GetF4();
    mat.ior   = reader.GetF4();

    char id[2];
    id[0] = reader.GetI1(),id[1] = reader.GetI1();

    if (id[0] == 'e' && id[1] == ':') {
        mat.tex_env.reset(new Texture());

        reader.GetI1();
        ReadString_Binary(mat.tex_env->path,reader);

        // advance to next texture-id
        id[0] = reader.GetI1(),id[1] = reader.GetI1();
    }

    if (id[0] == 't' && id[1] == ':') {
        mat.tex_color.reset(new Texture());

        reader.GetI1();
        ReadString_Binary(mat.tex_color->path,reader);

        mat.tex_color->transform.mTranslation.x = reader.GetF4();
        mat.tex_color->transform.mTranslation.y = reader.GetF4();

        mat.tex_color->transform.mScaling.x = reader.GetF4();
        mat.tex_color->transform.mScaling.y = reader.GetF4();

        // advance to next texture-id
        id[0] = reader.GetI1(),id[1] = reader.GetI1();
    }

    if (id[0] == 'b' && id[1] == ':') {
        mat.tex_bump.reset(new Texture());

        reader.GetI1();
        ReadString_Binary(mat.tex_bump->path,reader);

        mat.tex_bump->transform.mTranslation.x = reader.GetF4();
        mat.tex_bump->transform.mTranslation.y = reader.GetF4();

        mat.tex_bump->transform.mScaling.x = reader.GetF4();
        mat.tex_bump->transform.mScaling.y = reader.GetF4();

        // skip amplitude for I don't know its purpose.
        reader.GetF4();
    }
    reader.IncPtr(-2);
}